

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
nlohmann::json_abi_v3_11_3::
basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
::
parser<nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          *this,iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                adapter,parser_callback_t<basic_json<>_> *cb,bool allow_exceptions,
          bool ignore_comments)

{
  code *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  _Any_data local_38;
  code *local_28;
  undefined8 local_20;
  iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18;
  
  _Var2 = adapter.end._M_current;
  local_18.end = adapter.current._M_current;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (code *)0x0;
  local_20 = *(undefined8 *)(_Var2._M_current + 0x18);
  pcVar1 = *(code **)(_Var2._M_current + 0x10);
  if (pcVar1 != (code *)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)_Var2._M_current;
    local_38._8_8_ = *(undefined8 *)(_Var2._M_current + 8);
    _Var2._M_current[0x10] = '\0';
    _Var2._M_current[0x11] = '\0';
    _Var2._M_current[0x12] = '\0';
    _Var2._M_current[0x13] = '\0';
    _Var2._M_current[0x14] = '\0';
    _Var2._M_current[0x15] = '\0';
    _Var2._M_current[0x16] = '\0';
    _Var2._M_current[0x17] = '\0';
    _Var2._M_current[0x18] = '\0';
    _Var2._M_current[0x19] = '\0';
    _Var2._M_current[0x1a] = '\0';
    _Var2._M_current[0x1b] = '\0';
    _Var2._M_current[0x1c] = '\0';
    _Var2._M_current[0x1d] = '\0';
    _Var2._M_current[0x1e] = '\0';
    _Var2._M_current[0x1f] = '\0';
    local_28 = pcVar1;
  }
  local_18.current._M_current = (char *)this;
  detail::
  parser<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::parser(__return_storage_ptr__,&local_18,
           (parser_callback_t<nlohmann::json_abi_v3_11_3::basic_json<>_> *)&local_38,SUB81(cb,0),
           allow_exceptions);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static ::nlohmann::detail::parser<basic_json, InputAdapterType> parser(
InputAdapterType adapter,
detail::parser_callback_t<basic_json>cb = nullptr,
const bool allow_exceptions = true,
const bool ignore_comments = false
)
{
return ::nlohmann::detail::parser<basic_json, InputAdapterType>(std::move(adapter),
std::move(cb), allow_exceptions, ignore_comments);
}